

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O1

wchar_t archive_compressor_compress_write(archive_write_filter *f,void *buff,size_t length)

{
  byte bVar1;
  ushort uVar2;
  long *plVar3;
  uint uVar4;
  wchar_t wVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  
  if (length != 0) {
    plVar3 = (long *)f->data;
    if (*plVar3 == 0) {
      bVar1 = *buff;
      buff = (void *)((long)buff + 1);
      *(uint *)((long)plVar3 + 0x65164) = (uint)bVar1;
      *plVar3 = 1;
      length = length - 1;
    }
    if (length != 0) {
      do {
        bVar1 = *buff;
        *plVar3 = *plVar3 + 1;
        wVar5 = *(wchar_t *)((long)plVar3 + 0x65164);
        uVar4 = (uint)bVar1 << 0x10 | wVar5;
        *(uint *)(plVar3 + 0xca2d) = uVar4;
        uVar11 = wVar5 ^ (uint)bVar1 << 8;
        uVar10 = *(uint *)((long)plVar3 + (long)(int)uVar11 * 4 + 0x24);
        if (uVar10 == uVar4) {
          uVar2 = *(ushort *)((long)plVar3 + (long)(int)uVar11 * 2 + 0x43648);
LAB_001482dc:
          *(uint *)((long)plVar3 + 0x65164) = (uint)uVar2;
        }
        else {
          if (-1 < (int)uVar10) {
            iVar7 = uVar11 - 0x10d89;
            if ((uint)bVar1 << 8 == wVar5) {
              iVar7 = -1;
            }
            do {
              uVar10 = uVar11 + iVar7;
              uVar11 = uVar11 + 0x10d89 + iVar7;
              if (-1 < (int)uVar10) {
                uVar11 = uVar10;
              }
              uVar10 = *(uint *)((long)plVar3 + 0x24 + (long)(int)uVar11 * 4);
              if (uVar10 == uVar4) {
                uVar2 = *(ushort *)((long)plVar3 + (long)(int)uVar11 * 2 + 0x43648);
                goto LAB_001482dc;
              }
            } while (-1 < (int)uVar10);
          }
          wVar5 = output_code(f,wVar5);
          if (wVar5 != L'\0') {
            return wVar5;
          }
          *(uint *)((long)plVar3 + 0x65164) = (uint)bVar1;
          iVar7 = *(int *)((long)plVar3 + 0x6515c);
          if (iVar7 < (int)plVar3[4]) {
            *(int *)((long)plVar3 + 0x6515c) = iVar7 + 1;
            *(short *)((long)plVar3 + (long)(int)uVar11 * 2 + 0x43648) = (short)iVar7;
            *(int *)((long)plVar3 + (long)(int)uVar11 * 4 + 0x24) = (int)plVar3[0xca2d];
          }
          else {
            lVar6 = *plVar3;
            if (plVar3[2] <= lVar6) {
              plVar3[2] = lVar6 + 10000;
              if ((lVar6 < 0x800000) && (lVar9 = plVar3[1], lVar9 != 0)) {
                lVar6 = lVar6 << 8;
LAB_00148310:
                iVar7 = (int)(lVar6 / lVar9);
              }
              else {
                lVar9 = plVar3[1];
                lVar8 = lVar9 + 0xff;
                if (-1 < lVar9) {
                  lVar8 = lVar9;
                }
                iVar7 = (int)((ulong)lVar8 >> 8);
                if (iVar7 != 0) {
                  lVar9 = (long)iVar7;
                  goto LAB_00148310;
                }
                iVar7 = 0x7fffffff;
              }
              if ((int)plVar3[0xca2c] < iVar7) {
                *(int *)(plVar3 + 0xca2c) = iVar7;
              }
              else {
                *(undefined4 *)(plVar3 + 0xca2c) = 0;
                memset((void *)((long)plVar3 + 0x24),0xff,0x43624);
                *(undefined4 *)((long)plVar3 + 0x6515c) = 0x101;
                wVar5 = output_code(f,L'Ā');
                if (wVar5 != L'\0') {
                  return wVar5;
                }
              }
            }
          }
        }
        length = length - 1;
        buff = (void *)((long)buff + 1);
      } while (length != 0);
    }
  }
  return L'\0';
}

Assistant:

static int
archive_compressor_compress_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *state = (struct private_data *)f->data;
	int i;
	int ratio;
	int c, disp, ret;
	const unsigned char *bp;

	if (length == 0)
		return ARCHIVE_OK;

	bp = buff;

	if (state->in_count == 0) {
		state->cur_code = *bp++;
		++state->in_count;
		--length;
	}

	while (length--) {
		c = *bp++;
		state->in_count++;
		state->cur_fcode = (c << 16) | state->cur_code;
		i = ((c << HSHIFT) ^ state->cur_code);	/* Xor hashing. */

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] < 0)	/* Empty slot. */
			goto nomatch;
		/* Secondary hash (after G. Knott). */
		if (i == 0)
			disp = 1;
		else
			disp = HSIZE - i;
 probe:
		if ((i -= disp) < 0)
			i += HSIZE;

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] >= 0)
			goto probe;
 nomatch:
		ret = output_code(f, state->cur_code);
		if (ret != ARCHIVE_OK)
			return ret;
		state->cur_code = c;
		if (state->first_free < state->max_maxcode) {
			state->codetab[i] = state->first_free++;	/* code -> hashtable */
			state->hashtab[i] = state->cur_fcode;
			continue;
		}
		if (state->in_count < state->checkpoint)
			continue;

		state->checkpoint = state->in_count + CHECK_GAP;

		if (state->in_count <= 0x007fffff && state->out_count != 0)
			ratio = (int)(state->in_count * 256 / state->out_count);
		else if ((ratio = (int)(state->out_count / 256)) == 0)
			ratio = 0x7fffffff;
		else
			ratio = (int)(state->in_count / ratio);

		if (ratio > state->compress_ratio)
			state->compress_ratio = ratio;
		else {
			state->compress_ratio = 0;
			memset(state->hashtab, 0xff, sizeof(state->hashtab));
			state->first_free = FIRST;
			ret = output_code(f, CLEAR);
			if (ret != ARCHIVE_OK)
				return ret;
		}
	}

	return (ARCHIVE_OK);
}